

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * GetCandidates(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  wchar_t *pwVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  bool bVar4;
  __type_conflict _Var5;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __first;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __last;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  __result;
  TLangModel *this;
  reference pvVar6;
  TWords *pTVar7;
  reference this_00;
  size_type sVar8;
  const_reference pvVar9;
  reference pvVar10;
  long lVar11;
  unsigned_long *puVar12;
  initializer_list_t init;
  initializer_list_t init_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_240;
  allocator local_229;
  wstring local_228 [32];
  undefined1 local_208 [8];
  string candidateStr;
  TWord candidate;
  size_type local_1d0;
  size_t k;
  size_type local_1c0;
  ulong local_1b8;
  size_t candidatesSize;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_190;
  long local_180;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_178;
  undefined1 local_168 [8];
  json currentResult;
  wstring local_150 [8];
  wstring firstCandidate;
  undefined1 local_128 [8];
  TWords candidates;
  wstring local_108 [8];
  wstring wCurrWord;
  TWord currWord;
  ulong local_d0;
  size_t j;
  TWords *sentence;
  size_t i;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_a8;
  undefined1 local_98 [8];
  json results;
  TSentences sentences;
  NJamSpell local_40 [8];
  wstring input;
  string *text_local;
  TSpellCorrector *corrector_local;
  
  NJamSpell::UTF8ToWide(local_40,text);
  __first._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  __last._M_current = (wchar_t *)std::__cxx11::wstring::end();
  __result._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,unsigned_int(*)(unsigned_int)>
            (__first,__last,__result,towlower);
  this = NJamSpell::TSpellCorrector::GetLangModel(corrector);
  NJamSpell::TLangModel::Tokenize((TSentences *)&results.m_value,this,(wstring *)local_40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_98,(nullptr_t)0x0);
  std::
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      *)&i);
  init._M_len = i;
  init._M_array = (iterator)&local_a8;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::array(init);
  pvVar6 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_98,"results");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(pvVar6,&local_a8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_a8);
  for (sentence = (TWords *)0x0;
      pTVar7 = (TWords *)
               std::
               vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
               ::size((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       *)&results.m_value), sentence < pTVar7;
      sentence = (TWords *)
                 ((long)&(sentence->
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    this_00 = std::
              vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
              ::operator[]((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                            *)&results.m_value,(size_type)sentence);
    for (local_d0 = 0;
        sVar8 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size(this_00),
        local_d0 < sVar8; local_d0 = local_d0 + 1) {
      pvVar9 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                         (this_00,local_d0);
      pwVar3 = pvVar9->Ptr;
      pwVar1 = (wchar_t *)pvVar9->Len;
      currWord.Ptr = pwVar1;
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring
                (local_108,pwVar3,(ulong)pwVar1,
                 (allocator *)
                 ((long)&candidates.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::allocator<wchar_t>::~allocator
                ((allocator<wchar_t> *)
                 ((long)&candidates.
                         super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      NJamSpell::TSpellCorrector::GetCandidatesRaw((TWords *)local_128,corrector,this_00,local_d0);
      bVar4 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::empty
                        ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_128);
      if (!bVar4) {
        pvVar10 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                             local_128,0);
        pwVar1 = pvVar10->Ptr;
        pvVar10 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                            ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                             local_128,0);
        uVar2 = pvVar10->Len;
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring
                  (local_150,pwVar1,uVar2,(allocator *)((long)&currentResult.m_value + 7));
        std::allocator<wchar_t>::~allocator
                  ((allocator<wchar_t> *)((long)&currentResult.m_value + 7));
        _Var5 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)local_108,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)local_150);
        if (!_Var5) {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_168,(nullptr_t)0x0);
          lVar11 = std::__cxx11::wstring::operator[]((ulong)local_40);
          local_180 = (long)pwVar3 - lVar11 >> 2;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<long,_long,_0>(&local_178,&local_180);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_168,"pos_from");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar6,&local_178);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_178);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_190,(unsigned_long *)&currWord);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_168,"len");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar6,&local_190);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_190);
          std::
          initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::initializer_list((initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                              *)&candidatesSize);
          init_00._M_len = candidatesSize;
          init_00._M_array = (iterator)&local_1a0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::array(init_00);
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_168,"candidates");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=(pvVar6,&local_1a0);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json(&local_1a0);
          local_1c0 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::size
                                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                                 local_128);
          k = 7;
          puVar12 = std::min<unsigned_long>(&local_1c0,&k);
          local_1b8 = *puVar12;
          for (local_1d0 = 0; local_1d0 < local_1b8; local_1d0 = local_1d0 + 1) {
            pvVar10 = std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::operator[]
                                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
                                 local_128,local_1d0);
            pwVar3 = pvVar10->Ptr;
            uVar2 = pvVar10->Len;
            candidateStr.field_2._8_8_ = pwVar3;
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::wstring(local_228,pwVar3,uVar2,&local_229);
            NJamSpell::WideToUTF8((string *)local_208,(wstring *)local_228);
            std::__cxx11::wstring::~wstring(local_228);
            std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_229);
            pvVar6 = nlohmann::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                 *)local_168,"candidates");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_208);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::push_back(pvVar6,&local_240);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::~basic_json(&local_240);
            std::__cxx11::string::~string((string *)local_208);
          }
          pvVar6 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                               *)local_98,"results");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::push_back(pvVar6,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_168);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)local_168);
        }
        std::__cxx11::wstring::~wstring(local_150);
      }
      std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~vector
                ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_128);
      std::__cxx11::wstring::~wstring(local_108);
    }
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump(__return_storage_ptr__,
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)local_98,4,' ',false);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_98);
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)&results.m_value);
  std::__cxx11::wstring::~wstring((wstring *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCandidates(const NJamSpell::TSpellCorrector& corrector,
                          const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    std::transform(input.begin(), input.end(), input.begin(), std::towlower);
    NJamSpell::TSentences sentences = corrector.GetLangModel().Tokenize(input);

    nlohmann::json results;
    results["results"] = nlohmann::json::array();

    for (size_t i = 0; i < sentences.size(); ++i) {
        const NJamSpell::TWords& sentence = sentences[i];
        for (size_t j = 0; j < sentence.size(); ++j) {
            NJamSpell::TWord currWord = sentence[j];
            std::wstring wCurrWord(currWord.Ptr, currWord.Len);
            NJamSpell::TWords candidates = corrector.GetCandidatesRaw(sentence, j);
            if (candidates.empty()) {
                continue;
            }
            std::wstring firstCandidate(candidates[0].Ptr, candidates[0].Len);
            if (wCurrWord == firstCandidate) {
                continue;
            }
            nlohmann::json currentResult;
            currentResult["pos_from"] = currWord.Ptr - &input[0];
            currentResult["len"] = currWord.Len;
            currentResult["candidates"] = nlohmann::json::array();

            size_t candidatesSize = std::min(candidates.size(), size_t(7));
            for (size_t k = 0; k < candidatesSize; ++k) {
                NJamSpell::TWord candidate = candidates[k];
                std::string candidateStr = NJamSpell::WideToUTF8(std::wstring(candidate.Ptr, candidate.Len));
                currentResult["candidates"].push_back(candidateStr);
            }

            results["results"].push_back(currentResult);
        }
    }

    return results.dump(4);
}